

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O2

void __thiscall
duckdb::RadixPartitionedColumnData::InitializeAppendStateInternal
          (RadixPartitionedColumnData *this,PartitionedColumnDataAppendState *state)

{
  vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_true>
  *this_00;
  const_reference this_01;
  pointer this_02;
  reference this_03;
  type state_00;
  size_type __n;
  size_type __n_00;
  undefined1 local_48 [16];
  ClientContext *local_38;
  
  __n_00 = 1L << ((byte)this->radix_bits & 0x3f);
  this_00 = &state->partition_append_states;
  std::
  vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>_>_>
             *)this_00,__n_00);
  local_38 = (ClientContext *)&state->partition_buffers;
  local_48._8_8_ = state;
  std::
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             *)local_38,__n_00);
  for (__n = 0; __n_00 != __n; __n = __n + 1) {
    make_uniq<duckdb::ColumnDataAppendState>();
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,std::default_delete<duckdb::ColumnDataAppendState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,std::default_delete<duckdb::ColumnDataAppendState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ColumnDataAppendState,std::default_delete<duckdb::ColumnDataAppendState>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,std::default_delete<duckdb::ColumnDataAppendState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,std::default_delete<duckdb::ColumnDataAppendState>,true>>>
                *)this_00,
               (unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>
                *)local_48);
    ::std::
    unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>_>
                 *)local_48);
    this_01 = vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
              ::get<true>(&(this->super_PartitionedColumnData).partitions,__n);
    this_02 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator->(this_01);
    this_03 = vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_true>
              ::get<true>(this_00,__n);
    state_00 = unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>
               ::operator*(this_03);
    ColumnDataCollection::InitializeAppend(this_02,state_00);
    PartitionedColumnData::CreatePartitionBuffer((PartitionedColumnData *)local_48);
    ::std::
    vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
              ((vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                *)local_38,
               (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
               local_48);
    ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)local_48);
  }
  fixed_size_map_t<duckdb::list_entry_t>::resize
            ((fixed_size_map_t<duckdb::list_entry_t> *)(local_48._8_8_ + 0xb8),
             1L << ((byte)this->radix_bits & 0x3f));
  return;
}

Assistant:

void RadixPartitionedColumnData::InitializeAppendStateInternal(PartitionedColumnDataAppendState &state) const {
	const auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);
	state.partition_append_states.reserve(num_partitions);
	state.partition_buffers.reserve(num_partitions);
	for (idx_t i = 0; i < num_partitions; i++) {
		state.partition_append_states.emplace_back(make_uniq<ColumnDataAppendState>());
		partitions[i]->InitializeAppend(*state.partition_append_states[i]);
		state.partition_buffers.emplace_back(CreatePartitionBuffer());
	}

	// Initialize fixed-size map
	state.fixed_partition_entries.resize(RadixPartitioning::NumberOfPartitions(radix_bits));
}